

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

double Executor::exp(double __x)

{
  pointer pcVar1;
  long lVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  undefined1 uVar14;
  int iVar15;
  undefined4 *puVar16;
  Var *pVVar17;
  void *extraout_RAX;
  void *extraout_RAX_00;
  treeNode *ptVar18;
  long extraout_RAX_01;
  undefined4 *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  float fVar20;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  float fVar22;
  string op;
  undefined1 *local_a0 [2];
  undefined1 local_90 [4];
  Error in_stack_ffffffffffffff74;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (in_RDI[3] == 2) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,*(long *)(in_RDI + 0xc),
               *(long *)(in_RDI + 0xe) + *(long *)(in_RDI + 0xc));
    pVVar17 = getVar(&local_40);
    uVar19 = extraout_XMM0_Da_00;
    uVar21 = extraout_XMM0_Db_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      uVar19 = extraout_XMM0_Da_01;
      uVar21 = extraout_XMM0_Db_01;
    }
    switch(pVVar17->kind) {
    case Integer:
      ptVar18 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar18,(pVVar17->value).integer);
      uVar19 = extraout_XMM0_Da_02;
      uVar21 = extraout_XMM0_Db_02;
      break;
    case Decmical:
      ptVar18 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar18,(pVVar17->value).decmical);
      uVar19 = extraout_XMM0_Da_06;
      uVar21 = extraout_XMM0_Db_06;
      break;
    case Boolean:
      ptVar18 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar18,(pVVar17->value).boolean);
      uVar19 = extraout_XMM0_Da_03;
      uVar21 = extraout_XMM0_Db_03;
      break;
    case Text:
      ptVar18 = (treeNode *)operator_new(0x58);
      pcVar1 = (pVVar17->text)._M_dataplus._M_p;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar1,pcVar1 + (pVVar17->text)._M_string_length);
      treeNode::treeNode(ptVar18,&local_80);
      uVar19 = extraout_XMM0_Da_04;
      uVar21 = extraout_XMM0_Db_04;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
        uVar19 = extraout_XMM0_Da_05;
        uVar21 = extraout_XMM0_Db_05;
      }
      break;
    default:
      bVar13 = true;
      goto LAB_001099ed;
    }
    bVar13 = false;
LAB_001099ed:
    __x = (double)CONCAT44(uVar21,uVar19);
    if (!bVar13) goto LAB_0010a06b;
  }
  else if (in_RDI[3] == 1) {
    puVar16 = (undefined4 *)operator_new(0x58);
    uVar19 = in_RDI[1];
    uVar21 = in_RDI[2];
    uVar4 = in_RDI[3];
    uVar5 = in_RDI[4];
    uVar6 = in_RDI[5];
    uVar7 = in_RDI[6];
    uVar8 = in_RDI[7];
    uVar9 = in_RDI[8];
    uVar10 = in_RDI[9];
    uVar11 = in_RDI[10];
    uVar12 = in_RDI[0xb];
    *puVar16 = *in_RDI;
    puVar16[1] = uVar19;
    puVar16[2] = uVar21;
    puVar16[3] = uVar4;
    puVar16[4] = uVar5;
    puVar16[5] = uVar6;
    puVar16[6] = uVar7;
    puVar16[7] = uVar8;
    puVar16[8] = uVar9;
    puVar16[9] = uVar10;
    puVar16[10] = uVar11;
    puVar16[0xb] = uVar12;
    *(undefined4 **)(puVar16 + 0xc) = puVar16 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar16 + 0xc),*(long *)(in_RDI + 0xc),
               *(long *)(in_RDI + 0xe) + *(long *)(in_RDI + 0xc));
    *(undefined8 *)(puVar16 + 0x14) = *(undefined8 *)(in_RDI + 0x14);
    uVar19 = extraout_XMM0_Da;
    uVar21 = extraout_XMM0_Db;
    goto LAB_0010a06b;
  }
  if (*(int *)(*(long *)(in_RDI + 4) + 0xc) == 0) {
    dVar3 = exp(__x);
    uVar19 = SUB84(dVar3,0);
    uVar21 = (undefined4)((ulong)dVar3 >> 0x20);
    *(byte *)(extraout_RAX_01 + 0x54) = *(byte *)(extraout_RAX_01 + 0x54) ^ 1;
  }
  else {
    dVar3 = exp(__x);
    lVar2 = *(long *)(*(long *)(in_RDI + 6) + 0x30);
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              (SUB84(dVar3,0),local_a0,lVar2,*(long *)(*(long *)(in_RDI + 6) + 0x38) + lVar2);
    exp((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
    iVar15 = std::__cxx11::string::compare((char *)local_a0);
    if (iVar15 == 0) {
      if ((*(uint *)((long)extraout_RAX + 0x50) == 3) &&
         (*(int *)((long)extraout_RAX_00 + 0x50) == 3)) {
        ptVar18 = (treeNode *)operator_new(0x58);
        std::operator+(&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)extraout_RAX + 0x30),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)extraout_RAX_00 + 0x30));
        treeNode::treeNode(ptVar18,&local_60);
        uVar19 = extraout_XMM0_Da_09;
        uVar21 = extraout_XMM0_Db_09;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
          uVar19 = extraout_XMM0_Da_10;
          uVar21 = extraout_XMM0_Db_10;
        }
      }
      else {
        if ((1 < *(uint *)((long)extraout_RAX + 0x50)) ||
           (1 < *(uint *)((long)extraout_RAX_00 + 0x50))) goto LAB_0010a089;
        ptVar18 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar20 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
          fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar18,fVar20 + fVar22);
        uVar19 = extraout_XMM0_Da_11;
        uVar21 = extraout_XMM0_Db_11;
      }
    }
    else {
      iVar15 = std::__cxx11::string::compare((char *)local_a0);
      if (iVar15 == 0) {
        ptVar18 = (treeNode *)operator_new(0x58);
        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
          fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
        }
        else {
          fVar20 = *(float *)((long)extraout_RAX + 0x54);
        }
        if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
          fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
        }
        else {
          fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
        }
        treeNode::treeNode(ptVar18,fVar20 - fVar22);
        uVar19 = extraout_XMM0_Da_13;
        uVar21 = extraout_XMM0_Db_13;
      }
      else {
        iVar15 = std::__cxx11::string::compare((char *)local_a0);
        if (iVar15 == 0) {
          ptVar18 = (treeNode *)operator_new(0x58);
          if (*(int *)((long)extraout_RAX + 0x50) == 0) {
            fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
          }
          else {
            fVar20 = *(float *)((long)extraout_RAX + 0x54);
          }
          if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
            fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
          }
          else {
            fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
          }
          treeNode::treeNode(ptVar18,fVar20 * fVar22);
          uVar19 = extraout_XMM0_Da_14;
          uVar21 = extraout_XMM0_Db_14;
        }
        else {
          iVar15 = std::__cxx11::string::compare((char *)local_a0);
          if (iVar15 == 0) {
            if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
              fVar20 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
            }
            else {
              fVar20 = *(float *)((long)extraout_RAX_00 + 0x54);
            }
            if ((fVar20 == 0.0) && (!NAN(fVar20))) goto LAB_0010a089;
            ptVar18 = (treeNode *)operator_new(0x58);
            if (*(int *)((long)extraout_RAX + 0x50) == 0) {
              fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
            }
            else {
              fVar20 = *(float *)((long)extraout_RAX + 0x54);
            }
            if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
              fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
            }
            else {
              fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
            }
            treeNode::treeNode(ptVar18,fVar20 / fVar22);
            uVar19 = extraout_XMM0_Da_15;
            uVar21 = extraout_XMM0_Db_15;
          }
          else {
            iVar15 = std::__cxx11::string::compare((char *)local_a0);
            if ((iVar15 == 0) ||
               (iVar15 = std::__cxx11::string::compare((char *)local_a0), iVar15 == 0)) {
              if ((*(int *)((long)extraout_RAX_00 + 0x50) != 2) &&
                 (*(int *)((long)extraout_RAX + 0x50) != 2)) goto LAB_0010a089;
              iVar15 = std::__cxx11::string::compare((char *)local_a0);
              if (iVar15 == 0) {
                ptVar18 = (treeNode *)operator_new(0x58);
                if (*(char *)((long)extraout_RAX + 0x54) == '\x01') {
                  uVar14 = *(undefined1 *)((long)extraout_RAX_00 + 0x54);
                }
                else {
                  uVar14 = false;
                }
                treeNode::treeNode(ptVar18,(bool)uVar14);
                uVar19 = extraout_XMM0_Da_17;
                uVar21 = extraout_XMM0_Db_17;
              }
              else {
                iVar15 = std::__cxx11::string::compare((char *)local_a0);
                uVar19 = extraout_XMM0_Da_12;
                uVar21 = extraout_XMM0_Db_12;
                if (iVar15 == 0) {
                  ptVar18 = (treeNode *)operator_new(0x58);
                  uVar14 = true;
                  if (*(char *)((long)extraout_RAX + 0x54) == '\0') {
                    uVar14 = *(undefined1 *)((long)extraout_RAX_00 + 0x54);
                  }
                  treeNode::treeNode(ptVar18,(bool)uVar14);
                  uVar19 = extraout_XMM0_Da_16;
                  uVar21 = extraout_XMM0_Db_16;
                }
              }
            }
            else {
              if ((1 < *(uint *)((long)extraout_RAX + 0x50)) ||
                 (1 < *(uint *)((long)extraout_RAX_00 + 0x50))) {
LAB_0010a089:
                reportError(in_stack_ffffffffffffff74);
              }
              iVar15 = std::__cxx11::string::compare((char *)local_a0);
              if (iVar15 == 0) {
                ptVar18 = (treeNode *)operator_new(0x58);
                if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                  fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                }
                else {
                  fVar20 = *(float *)((long)extraout_RAX + 0x54);
                }
                if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                  fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                }
                else {
                  fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                }
                treeNode::treeNode(ptVar18,fVar22 < fVar20);
                uVar19 = extraout_XMM0_Da_18;
                uVar21 = extraout_XMM0_Db_18;
              }
              else {
                iVar15 = std::__cxx11::string::compare((char *)local_a0);
                if (iVar15 == 0) {
                  ptVar18 = (treeNode *)operator_new(0x58);
                  if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                    fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                  }
                  else {
                    fVar20 = *(float *)((long)extraout_RAX + 0x54);
                  }
                  if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                    fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                  }
                  else {
                    fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                  }
                  treeNode::treeNode(ptVar18,fVar20 < fVar22);
                  uVar19 = extraout_XMM0_Da_19;
                  uVar21 = extraout_XMM0_Db_19;
                }
                else {
                  iVar15 = std::__cxx11::string::compare((char *)local_a0);
                  if (iVar15 == 0) {
                    ptVar18 = (treeNode *)operator_new(0x58);
                    if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                      fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                    }
                    else {
                      fVar20 = *(float *)((long)extraout_RAX + 0x54);
                    }
                    if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                      fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                    }
                    else {
                      fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                    }
                    treeNode::treeNode(ptVar18,(bool)(-(fVar20 == fVar22) & 1));
                    uVar19 = extraout_XMM0_Da_20;
                    uVar21 = extraout_XMM0_Db_20;
                  }
                  else {
                    iVar15 = std::__cxx11::string::compare((char *)local_a0);
                    if (iVar15 == 0) {
                      ptVar18 = (treeNode *)operator_new(0x58);
                      if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                        fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                      }
                      else {
                        fVar20 = *(float *)((long)extraout_RAX + 0x54);
                      }
                      if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                        fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                      }
                      else {
                        fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                      }
                      treeNode::treeNode(ptVar18,(bool)(-(fVar20 != fVar22) & 1));
                      uVar19 = extraout_XMM0_Da_22;
                      uVar21 = extraout_XMM0_Db_22;
                    }
                    else {
                      iVar15 = std::__cxx11::string::compare((char *)local_a0);
                      if ((iVar15 == 0) ||
                         (iVar15 = std::__cxx11::string::compare((char *)local_a0), iVar15 == 0)) {
                        ptVar18 = (treeNode *)operator_new(0x58);
                        if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                          fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                        }
                        else {
                          fVar20 = *(float *)((long)extraout_RAX + 0x54);
                        }
                        if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                          fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                        }
                        else {
                          fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                        }
                        treeNode::treeNode(ptVar18,fVar20 <= fVar22);
                        uVar19 = extraout_XMM0_Da_21;
                        uVar21 = extraout_XMM0_Db_21;
                      }
                      else {
                        iVar15 = std::__cxx11::string::compare((char *)local_a0);
                        if ((iVar15 == 0) ||
                           (iVar15 = std::__cxx11::string::compare((char *)local_a0),
                           uVar19 = extraout_XMM0_Da_08, uVar21 = extraout_XMM0_Db_08, iVar15 == 0))
                        {
                          ptVar18 = (treeNode *)operator_new(0x58);
                          if (*(int *)((long)extraout_RAX + 0x50) == 0) {
                            fVar20 = (float)*(int *)((long)extraout_RAX + 0x54);
                          }
                          else {
                            fVar20 = *(float *)((long)extraout_RAX + 0x54);
                          }
                          if (*(int *)((long)extraout_RAX_00 + 0x50) == 0) {
                            fVar22 = (float)*(int *)((long)extraout_RAX_00 + 0x54);
                          }
                          else {
                            fVar22 = *(float *)((long)extraout_RAX_00 + 0x54);
                          }
                          treeNode::treeNode(ptVar18,fVar22 <= fVar20);
                          uVar19 = extraout_XMM0_Da_23;
                          uVar21 = extraout_XMM0_Db_23;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (extraout_RAX != (void *)0x0) {
      if (*(void **)((long)extraout_RAX + 0x30) != (void *)((long)extraout_RAX + 0x40)) {
        operator_delete(*(void **)((long)extraout_RAX + 0x30));
      }
      operator_delete(extraout_RAX);
      uVar19 = extraout_XMM0_Da_24;
      uVar21 = extraout_XMM0_Db_24;
    }
    if (extraout_RAX_00 != (void *)0x0) {
      if (*(void **)((long)extraout_RAX_00 + 0x30) != (void *)((long)extraout_RAX_00 + 0x40)) {
        operator_delete(*(void **)((long)extraout_RAX_00 + 0x30));
      }
      operator_delete(extraout_RAX_00);
      uVar19 = extraout_XMM0_Da_25;
      uVar21 = extraout_XMM0_Db_25;
    }
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0]);
      uVar19 = extraout_XMM0_Da_26;
      uVar21 = extraout_XMM0_Db_26;
    }
  }
LAB_0010a06b:
  return (double)CONCAT44(uVar21,uVar19);
}

Assistant:

treeNode* exp(treeNode* node)
    {
        treeNode* ret = nullptr;
        if(node->kind.expKind==ExpKind::constExp)return new treeNode(*node);
        if(node->kind.expKind==ExpKind::idExp)
        {
            auto retVar = getVar(node->text);
            switch(retVar->kind)
            {
                case AttrKind::Text:return new treeNode(retVar->text);
                case AttrKind::Integer:return new treeNode(retVar->value.integer);
                case AttrKind::Decmical:return new treeNode(retVar->value.decmical);
                case AttrKind::Boolean:return new treeNode(retVar->value.boolean);
            }
        }
        if(node->child[0]->kind.expKind==ExpKind::opExp)
        {
            ret = exp(node->child[1]);
            ret->attr.boolean=!ret->attr.boolean;
            return ret;
        }
        else 
        {
            auto left = exp(node->child[0]);
            string op = node->child[1]->text;
            auto right = exp(node->child[2]);
            if(op=="+")
            {
                if(left->attrKind==AttrKind::Text&&right->attrKind==AttrKind::Text)
                    ret = new treeNode(left->text + right->text);
                else if(checkDigit(left)&&checkDigit(right))
                    ret = new treeNode(GETDIGIT(left)+GETDIGIT(right));//string
                else
                    reportError(Error::errorType);
            } 
            else if(op=="-") ret = new treeNode(GETDIGIT(left)-GETDIGIT(right));
            else if(op=="*") ret = new treeNode(GETDIGIT(left)*GETDIGIT(right));
            else if(op=="/")
            {
                if(GETDIGIT(right)==0)
                    reportError(Error::divZero);
                else
                    ret = new treeNode(GETDIGIT(left)/GETDIGIT(right));
            }
            else if(op=="&&"||op=="||")
            {
                if(right->attrKind!=AttrKind::Boolean&&left->attrKind!=AttrKind::Boolean) 
                    reportError(Error::errorType);
                else if(op=="&&")ret = new treeNode(left->attr.boolean && right->attr.boolean);
                else if(op=="||")ret = new treeNode(left->attr.boolean || right->attr.boolean);
            }
            else
            {
                if(!(checkDigit(left)&&checkDigit(right)))reportError(Error::errorType);
                else if(op==">")ret = new treeNode(GETDIGIT(left)>GETDIGIT(right));
                else if(op=="<")ret = new treeNode(GETDIGIT(left)<GETDIGIT(right));
                else if(op=="==")ret = new treeNode(GETDIGIT(left)==GETDIGIT(right));
                else if(op=="!=")ret = new treeNode(GETDIGIT(left)!=GETDIGIT(right));
                else if(op=="<="||op=="=<")ret = new treeNode(GETDIGIT(left)<=GETDIGIT(right));
                else if(op==">="||op=="=>")ret = new treeNode(GETDIGIT(left)>=GETDIGIT(right));
            }
            delete left;
            delete right;
            return ret;
        }
    }